

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O3

vm_obj_id_t CVmObjLookupTable::create(int in_root_set,uint bucket_count,uint init_capacity)

{
  vm_obj_id_t obj_id;
  CVmObjLookupTable *this;
  
  obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,in_root_set,1,0);
  this = (CVmObjLookupTable *)CVmObject::operator_new(0x10,obj_id);
  CVmObjLookupTable(this,(ulong)bucket_count,(ulong)init_capacity);
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjLookupTable::create(VMG_ int in_root_set,
                                      uint bucket_count, uint init_capacity)
{
    vm_obj_id_t id;

    /* allocate the object ID */
    id = vm_new_id(vmg_ in_root_set, TRUE, FALSE);

    /* create the object */
    new (vmg_ id) CVmObjLookupTable(vmg_ bucket_count, init_capacity);

    /* return the new ID */
    return id;
}